

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMove3<(moira::Instr)71,(moira::Mode)11,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  char cVar5;
  char *pcVar6;
  long lVar7;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])();
  pcVar6 = "move";
  if (str->upper != false) {
    pcVar6 = "MOVE";
  }
  cVar5 = *pcVar6;
  while (cVar5 != '\0') {
    pcVar6 = pcVar6 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar5;
    cVar5 = *pcVar6;
  }
  if (str->upper == false) {
    cVar5 = '.';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar5;
      cVar5 = ".b"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  else {
    cVar5 = '.';
    lVar7 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar5;
      cVar5 = ".B"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '#';
  StrWriter::operator<<(str,(UInt)(uVar4 & 0xff));
  cVar5 = ',';
  lVar7 = 0;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar5;
    cVar5 = "), "[lVar7 + 2];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '(';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  cVar5 = ')';
  lVar7 = 0;
  do {
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = cVar5;
    cVar5 = ")+"[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 2);
  return;
}

Assistant:

void
Moira::dasmMove3(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_PI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}